

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall
tetgenmesh::calculateabovepoint
          (tetgenmesh *this,arraypool *facpoints,point *ppa,point *ppb,point *ppc)

{
  point pa;
  double *pdVar1;
  point pdVar2;
  long lVar3;
  double *pb;
  double *pdVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_48;
  undefined1 local_40 [16];
  
  pa = *(point *)*facpoints->toparray;
  dVar5 = 0.0;
  pb = (point)0x0;
  for (lVar3 = 1; lVar3 < facpoints->objects; lVar3 = lVar3 + 1) {
    pdVar4 = *(double **)
              (facpoints->toparray[(uint)lVar3 >> ((byte)facpoints->log2objectsperblock & 0x1f)] +
              (long)facpoints->objectbytes *
              (long)(int)(facpoints->objectsperblockmark & (uint)lVar3));
    dVar7 = (pdVar4[2] - pa[2]) * (pdVar4[2] - pa[2]) +
            (*pdVar4 - *pa) * (*pdVar4 - *pa) + (pdVar4[1] - pa[1]) * (pdVar4[1] - pa[1]);
    if (dVar7 <= dVar5) {
      dVar7 = dVar5;
      pdVar4 = pb;
    }
    pb = pdVar4;
    dVar5 = dVar7;
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    dVar7 = *pb - *pa;
    dVar8 = pb[1] - pa[1];
    dVar9 = pb[2] - pa[2];
    dVar10 = 0.0;
    pdVar4 = (point)0x0;
    for (lVar3 = 1; lVar3 < facpoints->objects; lVar3 = lVar3 + 1) {
      pdVar1 = *(double **)
                (facpoints->toparray[(uint)lVar3 >> ((byte)facpoints->log2objectsperblock & 0x1f)] +
                (long)facpoints->objectbytes *
                (long)(int)(facpoints->objectsperblockmark & (uint)lVar3));
      dVar12 = *pdVar1 - *pa;
      dVar11 = pdVar1[1] - pa[1];
      dVar13 = pdVar1[2] - pa[2];
      local_48 = dVar8 * dVar13 - dVar9 * dVar11;
      dVar13 = dVar13 * dVar7 - dVar9 * dVar12;
      local_40._8_8_ = dVar11 * dVar7 - dVar12 * dVar8;
      local_40._0_8_ = -dVar13;
      dVar11 = (double)local_40._8_8_ * (double)local_40._8_8_ +
               local_48 * local_48 + dVar13 * dVar13;
      if (dVar11 <= dVar10) {
        dVar11 = dVar10;
        pdVar1 = pdVar4;
      }
      pdVar4 = pdVar1;
      dVar10 = dVar11;
    }
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      facenormal(this,pa,pb,pdVar4,&local_48,1,(double *)0x0);
      dVar7 = SQRT(local_40._8_8_ * local_40._8_8_ +
                   local_48 * local_48 + local_40._0_8_ * local_40._0_8_);
      auVar6._8_8_ = dVar7;
      auVar6._0_8_ = dVar7;
      auVar6 = divpd(local_40,auVar6);
      dVar5 = dVar5 * 0.5;
      pdVar2 = this->dummypoint;
      *pdVar2 = (local_48 / dVar7) * dVar5 + *pa;
      local_40._0_8_ = auVar6._0_8_;
      pdVar2[1] = (double)local_40._0_8_ * dVar5 + pa[1];
      local_40._8_8_ = auVar6._8_8_;
      pdVar2[2] = dVar5 * (double)local_40._8_8_ + pa[2];
      if (ppa == (point *)0x0) {
        return true;
      }
      *ppa = pa;
      *ppb = pb;
      *ppc = pdVar4;
      return true;
    }
    if (this->b->quiet == 0) {
      printf("Warning:  All points of a facet are collinaer with [%d, %d].\n",
             (ulong)*(uint *)((long)pa + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pb + (long)this->pointmarkindex * 4));
      return false;
    }
  }
  else if (this->b->quiet == 0) {
    printf("Warning:  All points of a facet are coincident with %d.\n",
           (ulong)*(uint *)((long)pa + (long)this->pointmarkindex * 4));
    return false;
  }
  return false;
}

Assistant:

bool tetgenmesh::calculateabovepoint(arraypool *facpoints, point *ppa,
                                     point *ppb, point *ppc)
{
  point *ppt, pa, pb, pc;
  REAL v1[3], v2[3], n[3];
  REAL lab, len, A, area;
  REAL x, y, z;
  int i;

  ppt = (point *) fastlookup(facpoints, 0);
  pa = *ppt; // a is the first point.
  pb = pc = NULL; // Avoid compiler warnings.

  // Get a point b s.t. the length of [a, b] is maximal.
  lab = 0;
  for (i = 1; i < facpoints->objects; i++) {
    ppt = (point *) fastlookup(facpoints, i);
    x = (*ppt)[0] - pa[0];
    y = (*ppt)[1] - pa[1];
    z = (*ppt)[2] - pa[2];
    len = x * x + y * y + z * z;
    if (len > lab) {
      lab = len;
      pb = *ppt;
    }
  }
  lab = sqrt(lab);
  if (lab == 0) {
    if (!b->quiet) {
      printf("Warning:  All points of a facet are coincident with %d.\n",
        pointmark(pa));
    }
    return false;
  }

  // Get a point c s.t. the area of [a, b, c] is maximal.
  v1[0] = pb[0] - pa[0];
  v1[1] = pb[1] - pa[1];
  v1[2] = pb[2] - pa[2];
  A = 0;
  for (i = 1; i < facpoints->objects; i++) {
    ppt = (point *) fastlookup(facpoints, i);
    v2[0] = (*ppt)[0] - pa[0];
    v2[1] = (*ppt)[1] - pa[1];
    v2[2] = (*ppt)[2] - pa[2];
    cross(v1, v2, n);
    area = dot(n, n);
    if (area > A) {
      A = area;
      pc = *ppt;
    }
  }
  if (A == 0) {
    // All points are collinear. No above point.
    if (!b->quiet) {
      printf("Warning:  All points of a facet are collinaer with [%d, %d].\n",
        pointmark(pa), pointmark(pb));
    }
    return false;
  }

  // Calculate an above point of this facet.
  facenormal(pa, pb, pc, n, 1, NULL);
  len = sqrt(dot(n, n));
  n[0] /= len;
  n[1] /= len;
  n[2] /= len;
  lab /= 2.0; // Half the maximal length.
  dummypoint[0] = pa[0] + lab * n[0];
  dummypoint[1] = pa[1] + lab * n[1];
  dummypoint[2] = pa[2] + lab * n[2];

  if (ppa != NULL) {
    // Return the three points.
    *ppa = pa;
    *ppb = pb;
    *ppc = pc;
  }

  return true;
}